

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error asmjit::CodeHolder_evaluateExpression(CodeHolder *self,Expression *exp,uint64_t *out)

{
  Slot *pSVar1;
  bool bVar2;
  Error EVar3;
  long lVar4;
  ulong uVar5;
  Slot *pSVar6;
  ulong uVar7;
  bool bVar8;
  ulong *puVar9;
  ulong local_58 [2];
  Expression *local_48;
  ulong local_40;
  Slot *local_38;
  
  lVar4 = 0;
  puVar9 = local_58;
  bVar2 = true;
  local_48 = exp;
  do {
    bVar8 = bVar2;
    pSVar6 = (Slot *)(ulong)*(byte *)((long)(self->_allocator)._slots + lVar4 + -0x47);
    if ((Slot *)0x3 < pSVar6) {
      return 3;
    }
    switch(pSVar6) {
    case (Slot *)0x1:
      pSVar6 = (self->_allocator)._slots[lVar4 + -8];
      break;
    case (Slot *)0x2:
      pSVar6 = (self->_allocator)._slots[lVar4 + -8];
      pSVar1 = pSVar6[4].next;
      if (pSVar1 == (Slot *)0x0) {
        return 0x43;
      }
      pSVar6 = (Slot *)((long)&(pSVar1[2].next)->next + (long)&(pSVar6[3].next)->next);
      break;
    case (Slot *)0x3:
      EVar3 = CodeHolder_evaluateExpression
                        ((CodeHolder *)(self->_allocator)._slots[lVar4 + -8],(Expression *)&local_38
                         ,(uint64_t *)
                          ((long)&switchD_00114c75::switchdataD_00136004 +
                          (long)(int)(&switchD_00114c75::switchdataD_00136004)[(long)pSVar6]));
      pSVar6 = local_38;
      if (EVar3 != 0) {
        return EVar3;
      }
    }
    *puVar9 = (ulong)pSVar6;
    lVar4 = 1;
    puVar9 = &local_40;
    bVar2 = false;
  } while (bVar8);
  switch((self->_environment)._arch) {
  case '\0':
    uVar5 = local_40 + local_58[0];
    break;
  case '\x01':
    uVar5 = local_58[0] - local_40;
    break;
  case '\x02':
    uVar5 = local_40 * local_58[0];
    break;
  case '\x03':
    uVar7 = local_58[0] << ((byte)local_40 & 0x3f);
    goto LAB_00114d20;
  case '\x04':
    uVar7 = local_58[0] >> ((byte)local_40 & 0x3f);
LAB_00114d20:
    uVar5 = 0;
    if (local_40 < 0x40) {
      uVar5 = uVar7;
    }
    break;
  case '\x05':
    uVar5 = 0x3f;
    if (local_40 < 0x3f) {
      uVar5 = local_40;
    }
    uVar5 = (long)local_58[0] >> ((byte)uVar5 & 0x3f);
    break;
  default:
    return 3;
  }
  local_48->opType = (char)uVar5;
  local_48->valueType[0] = (char)(uVar5 >> 8);
  local_48->valueType[1] = (char)(uVar5 >> 0x10);
  local_48->reserved[0] = (char)(uVar5 >> 0x18);
  local_48->reserved[1] = (char)(uVar5 >> 0x20);
  local_48->reserved[2] = (char)(uVar5 >> 0x28);
  local_48->reserved[3] = (char)(uVar5 >> 0x30);
  local_48->reserved[4] = (char)(uVar5 >> 0x38);
  return 0;
}

Assistant:

static Error CodeHolder_evaluateExpression(CodeHolder* self, Expression* exp, uint64_t* out) noexcept {
  uint64_t value[2];
  for (size_t i = 0; i < 2; i++) {
    uint64_t v;
    switch (exp->valueType[i]) {
      case Expression::kValueNone: {
        v = 0;
        break;
      }

      case Expression::kValueConstant: {
        v = exp->value[i].constant;
        break;
      }

      case Expression::kValueLabel: {
        LabelEntry* le = exp->value[i].label;
        if (!le->isBound())
          return DebugUtils::errored(kErrorExpressionLabelNotBound);
        v = le->section()->offset() + le->offset();
        break;
      }

      case Expression::kValueExpression: {
        Expression* nested = exp->value[i].expression;
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(self, nested, &v));
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    value[i] = v;
  }

  uint64_t result;
  uint64_t& a = value[0];
  uint64_t& b = value[1];

  switch (exp->opType) {
    case Expression::kOpAdd:
      result = a + b;
      break;

    case Expression::kOpSub:
      result = a - b;
      break;

    case Expression::kOpMul:
      result = a * b;
      break;

    case Expression::kOpSll:
      result = (b > 63) ? uint64_t(0) : uint64_t(a << b);
      break;

    case Expression::kOpSrl:
      result = (b > 63) ? uint64_t(0) : uint64_t(a >> b);
      break;

    case Expression::kOpSra:
      result = Support::sar(a, Support::min<uint64_t>(b, 63));
      break;

    default:
      return DebugUtils::errored(kErrorInvalidState);
  }

  *out = result;
  return kErrorOk;
}